

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O2

void __thiscall
Editor::Editor(Editor *this,Board *board,RenderWindow *window,MessageLogSinkMt *messageLogSink)

{
  Text *this_00;
  View *this_01;
  Vector2f *pVVar1;
  ResourceBase *pRVar2;
  undefined4 extraout_var;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  locale local_88 [8];
  path *local_80;
  EditorInterface *local_78;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_70
  ;
  path local_50;
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Editor_0026d880;
  EditorInterface::EditorInterface(&this->interface_,this,window,messageLogSink);
  this->board_ = board;
  local_78 = &this->interface_;
  ghc::filesystem::current_path();
  local_80 = &this->workingDirectory_;
  OffsetView::OffsetView(&this->editView_,1024.0);
  this->zoomLevel_ = 1.0;
  (this->mousePos_).x = 0;
  (this->mousePos_).y = 0;
  this->mouseLeftIsDragging_ = false;
  this->mouseOnScreen_ = false;
  this_01 = sf::RenderTarget::getDefaultView(&window->super_RenderTarget);
  pVVar1 = sf::View::getSize(this_01);
  fVar3 = (*pVVar1).x;
  iVar5 = (int)fVar3;
  fVar4 = (*pVVar1).y;
  iVar6 = (int)fVar4;
  this->windowSize_ =
       (Vector2u)
       (CONCAT44((int)(fVar4 - 2.1474836e+09),(int)(fVar3 - 2.1474836e+09)) &
        CONCAT44(iVar6 >> 0x1f,iVar5 >> 0x1f) | CONCAT44(iVar6,iVar5));
  local_70._M_dataplus._M_p = (pointer)0x4200000042000000;
  sf::RectangleShape::RectangleShape(&this->cursor_,(Vector2f *)&local_70);
  (this->cursorCoords_).first.x = 0;
  (this->cursorCoords_).first.y = 0;
  (this->cursorCoords_).second = false;
  this->cursorState_ = empty;
  this->cursorVisible_ = false;
  (this->selectionStart_).first.x = 0;
  (this->selectionStart_).first.y = 0;
  (this->selectionStart_).second = false;
  (this->selectionEnd_).x = 0;
  (this->selectionEnd_).y = 0;
  std::locale::locale(local_88);
  sf::String::String((String *)&local_70,"",local_88);
  pRVar2 = Locator::getResource();
  ghc::filesystem::path::path<char[23],ghc::filesystem::path>
            (&local_50,(char (*) [23])"resources/consolas.ttf",auto_format);
  iVar5 = (*pRVar2->_vptr_ResourceBase[3])(pRVar2,&local_50);
  this_00 = &this->wireToolLabel_;
  sf::Text::Text(this_00,(String *)&local_70,(Font *)CONCAT44(extraout_var,iVar5),0x16);
  ghc::filesystem::path::~path(&local_50);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_70);
  std::locale::~locale(local_88);
  (this->wireToolStart_).x = 0;
  (this->wireToolStart_).y = 0;
  this->wireToolVerticalFirst_ = false;
  this->wireToolWireState_ = low;
  SubBoard::SubBoard(&this->tileSubBoard_);
  SubBoard::SubBoard(&this->copySubBoard_);
  TilePool::TilePool(&this->tilePool_);
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->editHistory_).
  super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ::_Deque_base(&(this->editHistory_).
                 super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
               );
  this->savedEditSize_ = 0;
  this->maxEditHistory_ = 0;
  this->lastEditSize_ = 0;
  if (Editor(Board&,sf::RenderWindow&,MessageLogSink<std::mutex>*)::staticInit == '\0') {
    iVar5 = __cxa_guard_acquire(&Editor(Board&,sf::RenderWindow&,MessageLogSink<std::mutex>*)::
                                 staticInit);
    if (iVar5 != 0) {
      StaticInit::StaticInit(&Editor::staticInit);
      __cxa_guard_release(&Editor(Board&,sf::RenderWindow&,MessageLogSink<std::mutex>*)::staticInit)
      ;
    }
  }
  staticInit_ = &Editor::staticInit;
  defaultZoom(this);
  sf::Color::Color((Color *)&local_70,0xff,'P',0xff,'d');
  sf::Shape::setFillColor(&(this->cursor_).super_Shape,(Color *)&local_70);
  sf::Text::setOutlineColor(this_00,(Color *)&sf::Color::Black);
  sf::Text::setOutlineThickness(this_00,2.0);
  return;
}

Assistant:

Editor::Editor(Board& board, sf::RenderWindow& window, MessageLogSinkMt* messageLogSink) :
    interface_(*this, window, messageLogSink),
    board_(board),
    workingDirectory_(fs::current_path()),
    editView_(static_cast<float>(TileWidth::TEXELS * Chunk::WIDTH)),
    zoomLevel_(1.0f),
    mousePos_(),
    mouseLeftIsDragging_(false),
    mouseOnScreen_(false),
    windowSize_(window.getDefaultView().getSize()),
    cursor_({static_cast<float>(TileWidth::TEXELS), static_cast<float>(TileWidth::TEXELS)}),
    cursorCoords_({sf::Vector2i(), false}),
    cursorState_(CursorState::empty),
    cursorVisible_(false),
    selectionStart_({sf::Vector2i(), false}),
    selectionEnd_(),
    wireToolLabel_("", Locator::getResource()->getFont("resources/consolas.ttf"), 22),
    wireToolStart_(),
    wireToolVerticalFirst_(false),
    wireToolWireState_(State::low),
    tileSubBoard_(),
    copySubBoard_(),
    tilePool_(),
    editHistory_(),
    maxEditHistory_(0),
    lastEditSize_(0),
    savedEditSize_(0) {

    static StaticInit staticInit;
    staticInit_ = &staticInit;

    defaultZoom();
    cursor_.setFillColor({255, 80, 255, 100});
    wireToolLabel_.setOutlineColor(sf::Color::Black);
    wireToolLabel_.setOutlineThickness(2.0f);
}